

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_logger.cpp
# Opt level: O0

shared_ptr<cppnet::Log> __thiscall cppnet::BaseLogger::GetLog(BaseLogger *this)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  anon_class_8_1_8991fb9c_for__M_tp in_RSI;
  shared_ptr<cppnet::Log> sVar2;
  anon_class_8_1_8991fb9c_for__M_tp deleter;
  Log *log;
  BaseLogger *this_local;
  
  deleter.this = (BaseLogger *)0x0;
  bVar1 = ThreadSafeQueue<cppnet::Log_*>::Pop(&(in_RSI.this)->_cache_queue,(Log **)&deleter);
  if (!bVar1) {
    deleter.this = (BaseLogger *)NewLog(in_RSI.this);
  }
  std::shared_ptr<cppnet::Log>::shared_ptr<cppnet::Log,cppnet::BaseLogger::GetLog()::__0,void>
            ((shared_ptr<cppnet::Log> *)this,(Log *)deleter.this,in_RSI);
  sVar2.super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<cppnet::Log>)sVar2.super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Log> BaseLogger::GetLog() {
    Log* log = nullptr;
    if (_cache_queue.Pop(log)) {

    } else {
        log = NewLog();
    }

    auto deleter = [this](Log *l) { FreeLog(l); };

    return std::shared_ptr<Log>(log, deleter);
}